

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

size_t __thiscall capnp::SchemaFile::DiskSchemaFile::hashCode(DiskSchemaFile *this)

{
  String *pSVar1;
  size_t sVar2;
  char *pcVar3;
  String *part;
  String *pSVar4;
  char *pcVar5;
  ReadableDirectory *pRVar6;
  
  pRVar6 = this->baseDir;
  sVar2 = (this->path).parts.size_;
  if (sVar2 != 0) {
    pSVar4 = (this->path).parts.ptr;
    pSVar1 = pSVar4 + sVar2;
    do {
      pcVar3 = (pSVar4->content).ptr;
      sVar2 = (pSVar4->content).size_;
      pcVar5 = pcVar3 + (sVar2 - 1);
      if (sVar2 == 0) {
        pcVar3 = (char *)0x0;
        pcVar5 = (char *)0x0;
      }
      for (; pcVar3 != pcVar5; pcVar3 = pcVar3 + 1) {
        pRVar6 = (ReadableDirectory *)((long)pRVar6 * 0x21 ^ (long)*pcVar3);
      }
      pRVar6 = (ReadableDirectory *)((long)pRVar6 * 0x21 ^ 0x2f);
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  return (size_t)pRVar6;
}

Assistant:

size_t hashCode() const override {
    // djb hash with xor
    // TODO(someday):  Add hashing library to KJ.
    size_t result = reinterpret_cast<uintptr_t>(&baseDir);
    for (auto& part: path) {
      for (char c: part) {
        result = (result * 33) ^ c;
      }
      result = (result * 33) ^ '/';
    }
    return result;
  }